

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrtarga.c
# Opt level: O2

void put_pixel_rows(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  J_COLOR_SPACE JVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  JSAMPARRAY *pppJVar9;
  long lVar10;
  JSAMPROW __src;
  ulong uVar11;
  JDIMENSION JVar12;
  JSAMPARRAY __dest;
  bool bVar13;
  double dVar14;
  
  if (*(int *)&dinfo[1].output_file == 0) {
    pppJVar9 = &dinfo[1].buffer;
  }
  else {
    pppJVar9 = (JSAMPARRAY *)
               (*cinfo->mem->access_virt_sarray)
                         ((j_common_ptr)cinfo,(jvirt_sarray_ptr)dinfo[1].put_pixel_rows,
                          *(JDIMENSION *)((long)&dinfo[1].calc_buffer_dimensions + 4),1,1);
    piVar1 = (int *)((long)&dinfo[1].calc_buffer_dimensions + 4);
    *piVar1 = *piVar1 + 1;
  }
  __dest = *pppJVar9;
  __src = *dinfo->buffer;
  JVar4 = cinfo->out_color_space;
  uVar11 = (ulong)JVar4;
  if (uVar11 == 4) {
    JVar12 = cinfo->output_width;
    for (lVar10 = 0; JVar12 != (JDIMENSION)lVar10; lVar10 = lVar10 + 1) {
      bVar2 = __src[lVar10 * 4 + 1];
      dVar14 = (double)__src[lVar10 * 4 + 3];
      bVar3 = __src[lVar10 * 4 + 2];
      *(JSAMPLE *)((long)__dest + 2) =
           (JSAMPLE)(int)(((double)__src[lVar10 * 4] * dVar14) / 255.0 + 0.5);
      *(JSAMPLE *)((long)__dest + 1) = (JSAMPLE)(int)(((double)bVar2 * dVar14) / 255.0 + 0.5);
      *(JSAMPLE *)__dest = (JSAMPLE)(int)(((double)bVar3 * dVar14) / 255.0 + 0.5);
      __dest = (JSAMPARRAY)((long)__dest + 3);
    }
  }
  else if (JVar4 == JCS_RGB565) {
    JVar12 = cinfo->output_width;
    for (lVar10 = 0; JVar12 != (JDIMENSION)lVar10; lVar10 = lVar10 + 1) {
      *(JSAMPLE *)__dest = __src[lVar10 * 2] << 3;
      *(byte *)((long)__dest + 1) = (byte)(*(ushort *)(__src + lVar10 * 2) >> 3) & 0xfc;
      *(byte *)((long)__dest + 2) = __src[lVar10 * 2 + 1] & 0xf8;
      __dest = (JSAMPARRAY)((long)__dest + 3);
    }
  }
  else if (JVar4 == JCS_EXT_BGR) {
    memcpy(__dest,__src,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4));
    __dest = (JSAMPARRAY)((long)__dest + (ulong)(cinfo->output_width * 3));
  }
  else {
    iVar8 = rgb_red[uVar11];
    iVar5 = rgb_green[uVar11];
    iVar6 = rgb_blue[uVar11];
    iVar7 = rgb_pixelsize[uVar11];
    JVar12 = cinfo->output_width;
    while (bVar13 = JVar12 != 0, JVar12 = JVar12 - 1, bVar13) {
      *(JSAMPLE *)__dest = __src[iVar6];
      *(JSAMPLE *)((long)__dest + 1) = __src[iVar5];
      *(JSAMPLE *)((long)__dest + 2) = __src[iVar8];
      __dest = (JSAMPARRAY)((long)__dest + 3);
      __src = __src + iVar7;
    }
  }
  for (iVar8 = *(int *)&dinfo[1].calc_buffer_dimensions; 0 < iVar8; iVar8 = iVar8 + -1) {
    *(JSAMPLE *)__dest = '\0';
    __dest = (JSAMPARRAY)((long)__dest + 1);
  }
  if (*(int *)&dinfo[1].output_file != 0) {
    return;
  }
  fwrite(dinfo[1].buffer,1,(ulong)*(uint *)((long)&dinfo[1].finish_output + 4),
         (FILE *)dinfo->output_file);
  return;
}

Assistant:

METHODDEF(void)
put_pixel_rows(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
               JDIMENSION rows_supplied)
/* used for unquantized full-color output */
{
  tga_dest_ptr dest = (tga_dest_ptr)dinfo;
  register JSAMPROW inptr;
  register char *outptr;
  register JDIMENSION col;

  inptr = dest->pub.buffer[0];
  outptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    outptr[0] = inptr[2]; /* RGB to BGR order */
    outptr[1] = inptr[1];
    outptr[2] = inptr[0];
    inptr += 3, outptr += 3;
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}